

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

bool __thiscall IR::FloatConstOpnd::IsEqualInternal(FloatConstOpnd *this,Opnd *opnd)

{
  double dVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  FloatConstOpnd *pFVar5;
  
  if ((this->super_Opnd).m_kind != OpndKindFloatConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x709,"(m_kind == OpndKindFloatConst)","m_kind == OpndKindFloatConst");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if ((opnd->m_kind == OpndKindFloatConst) && ((this->super_Opnd).m_type == opnd->m_type)) {
    dVar1 = this->m_value;
    pFVar5 = Opnd::AsFloatConstOpnd(opnd);
    bVar3 = (bool)(-(dVar1 == pFVar5->m_value) & 1);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool
FloatConstOpnd::IsEqualInternal(Opnd *opnd)
{
    Assert(m_kind == OpndKindFloatConst);
    if (!opnd->IsFloatConstOpnd() || this->GetType() != opnd->GetType())
    {
        return false;
    }

    return m_value == opnd->AsFloatConstOpnd()->m_value;
}